

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O1

void stringify_server_ID(uchar *ID,char *buffer,int len)

{
  byte bVar1;
  uint uVar2;
  uchar uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *__format;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  version_3_format_ID *id3;
  
  if (ID == (uchar *)0x0) {
    uVar3 = 0xff;
  }
  else if ((((ID[4] == '\0') && (ID[5] == '\0')) && (ID[6] == '\0')) && (ID[7] == '\0')) {
    uVar3 = '\0';
  }
  else {
    uVar3 = *ID;
  }
  if (uVar3 == '\x02') {
    if (len < 0x4e) {
      return;
    }
    uVar6 = get_rep_len_format_ID(ID);
    bVar1 = *ID;
    uVar9 = *(uint *)(ID + 4);
    uVar2 = *(uint *)(ID + 8);
    uVar8 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18)
    ;
    uVar9 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    __format = "<ID ver=%d, rep_len %d, hash1 %x, hash2 %x>\n";
    uVar7 = (ulong)uVar6;
  }
  else {
    if (uVar3 != '\x01') {
      if (uVar3 != '\0') {
        if (len < 0x1e) {
          return;
        }
        snprintf(buffer,(ulong)(uint)len,"<Unknown format version %d\n",(ulong)*ID);
        return;
      }
      if (len < 0x10) {
        return;
      }
      lVar10 = 0;
      iVar4 = 0;
      do {
        iVar5 = snprintf(buffer + iVar4,(long)(len - iVar4),"%2x",(ulong)ID[lVar10]);
        iVar4 = iVar5 + iVar4;
        lVar10 = lVar10 + 1;
      } while (lVar10 != 8);
      return;
    }
    if (len < 0x4e) {
      return;
    }
    uVar9 = *(uint *)(ID + 4);
    uVar7 = (ulong)ID[1];
    bVar1 = *ID;
    uVar8 = (ulong)(ushort)(*(ushort *)(ID + 2) << 8 | *(ushort *)(ID + 2) >> 8);
    uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    __format = "<ID ver=%d, salt %d, port %d, IP_addr %x, formatID %d>\n";
  }
  snprintf(buffer,(ulong)(uint)len,__format,(ulong)bVar1,uVar7,uVar8,(ulong)uVar9);
  return;
}

Assistant:

extern void
stringify_server_ID(unsigned char *ID, char *buffer, int len)
{
    int id_size = 8;
    int point = 0;
    int i;
    switch (version_of_format_ID(ID)) {
    case 0:
	if (len < id_size * 2) break;
	for (i = 0; i < id_size; i++) {
	    point += snprintf(&buffer[point], len - point, "%2x", ID[i]);
	}
	break;
    case 1:{
	version_1_format_ID id1;
	memcpy(&id1, ID, 10);
	if (len < 3+3+6+10+6+50) /* approx size */ return;
	snprintf(buffer, len, "<ID ver=%d, salt %d, port %d, IP_addr %x, formatID %d>\n",
	       id1.version, id1.salt, ntohs(id1.port),
	       ntohl(id1.IP_addr), ntohs(id1.format_identifier));
	    break;
	}
    case 2:{
	version_3_format_ID *id3 = (version_3_format_ID*)ID;
	if (len < 3+3+6+10+6+50) /* approx size */ return;
	int rep_len = get_rep_len_format_ID(ID);
	snprintf(buffer, len, "<ID ver=%d, rep_len %d, hash1 %x, hash2 %x>\n",
	       id3->version, rep_len,
	       ntohl(id3->hash1), ntohl(id3->hash2));
	    break;
	}
    default:
	if (len < 30) return;
	snprintf(buffer, len, "<Unknown format version %d\n",
	       *((unsigned char *) ID));
	break;
    }
}